

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void CompressTables(lemon *lemp)

{
  state *psVar1;
  state *psVar2;
  bool bVar3;
  int iVar4;
  symbol *psVar5;
  action *paVar6;
  action *paVar7;
  int iVar8;
  int iVar9;
  action *paVar10;
  long lVar11;
  state *psVar12;
  
  iVar4 = lemp->nstate;
  if (0 < iVar4) {
    lVar11 = 0;
    do {
      psVar1 = lemp->sorted[lVar11];
      paVar6 = psVar1->ap;
      if (paVar6 != (action *)0x0) {
        bVar3 = false;
        iVar8 = 0;
        psVar12 = (state *)0x0;
        paVar7 = paVar6;
        do {
          if (paVar7->type == REDUCE) {
            psVar2 = (paVar7->x).stp;
            if ((psVar2->statenum == 0) && (psVar2 != psVar12)) {
              iVar9 = 1;
              for (paVar10 = paVar7->next; paVar10 != (action *)0x0; paVar10 = paVar10->next) {
                if (paVar10->type == REDUCE) {
                  iVar9 = iVar9 + (uint)((paVar10->x).stp == psVar2 && (paVar10->x).stp != psVar12);
                }
              }
              if (iVar8 < iVar9) {
                psVar12 = psVar2;
                iVar8 = iVar9;
              }
            }
          }
          else if ((paVar7->type == SHIFT) && (paVar7->sp == lemp->wildcard)) {
            bVar3 = true;
          }
          paVar7 = paVar7->next;
        } while (paVar7 != (action *)0x0);
        if ((0 < iVar8) && (!bVar3)) {
          while( true ) {
            if (paVar6 == (action *)0x0) {
              __assert_fail("ap",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/misc/lemon.c"
                            ,0x1057,"void CompressTables(struct lemon *)");
            }
            if ((paVar6->type == REDUCE) && ((paVar6->x).stp == psVar12)) break;
            paVar6 = paVar6->next;
          }
          psVar5 = Symbol_new("{default}");
          paVar6->sp = psVar5;
          for (paVar6 = paVar6->next; paVar6 != (action *)0x0; paVar6 = paVar6->next) {
            if ((paVar6->type == REDUCE) && ((paVar6->x).stp == psVar12)) {
              paVar6->type = NOT_USED;
            }
          }
          paVar6 = (action *)msort((char *)psVar1->ap,(char **)&psVar1->ap->next,actioncmp);
          psVar1->ap = paVar6;
          iVar4 = lemp->nstate;
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < iVar4);
  }
  return;
}

Assistant:

void CompressTables(struct lemon *lemp)
{
  struct state *stp;
  struct action *ap, *ap2;
  struct rule *rp, *rp2, *rbest;
  int nbest, n;
  int i;
  int usesWildcard;

  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    nbest = 0;
    rbest = 0;
    usesWildcard = 0;

    for(ap=stp->ap; ap; ap=ap->next){
      if( ap->type==SHIFT && ap->sp==lemp->wildcard ){
        usesWildcard = 1;
      }
      if( ap->type!=REDUCE ) continue;
      rp = ap->x.rp;
      if( rp->lhsStart ) continue;
      if( rp==rbest ) continue;
      n = 1;
      for(ap2=ap->next; ap2; ap2=ap2->next){
        if( ap2->type!=REDUCE ) continue;
        rp2 = ap2->x.rp;
        if( rp2==rbest ) continue;
        if( rp2==rp ) n++;
      }
      if( n>nbest ){
        nbest = n;
        rbest = rp;
      }
    }
 
    /* Do not make a default if the number of rules to default
    ** is not at least 1 or if the wildcard token is a possible
    ** lookahead.
    */
    if( nbest<1 || usesWildcard ) continue;


    /* Combine matching REDUCE actions into a single default */
    for(ap=stp->ap; ap; ap=ap->next){
      if( ap->type==REDUCE && ap->x.rp==rbest ) break;
    }
    assert( ap );
    ap->sp = Symbol_new("{default}");
    for(ap=ap->next; ap; ap=ap->next){
      if( ap->type==REDUCE && ap->x.rp==rbest ) ap->type = NOT_USED;
    }
    stp->ap = Action_sort(stp->ap);
  }
}